

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

void __thiscall Liby::ExitCaller::callImp(ExitCaller *this,function<void_()> *functor)

{
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> G_;
  function<void_()> *functor_local;
  ExitCaller *this_local;
  
  G_._M_device = (mutex_type *)functor;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&ExitCallerMutex);
  std::__cxx11::list<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::push_back
            (&ExitCallerFunctors_abi_cxx11_,(value_type *)G_._M_device);
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return;
}

Assistant:

void ExitCaller::callImp(const std::function<void()> &functor) {
    std::lock_guard<std::mutex> G_(ExitCallerMutex);
    ExitCallerFunctors.push_back(functor);
}